

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_function.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateExpression
          (StatisticsPropagator *this,BoundFunctionExpression *func,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined8 uVar2;
  pointer this_00;
  reference this_01;
  pointer pEVar3;
  _Hash_node_base *in_RCX;
  ulong __n;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stat;
  vector<duckdb::BaseStatistics,_true> stats;
  FunctionStatisticsInput input;
  undefined1 local_d0 [8];
  vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> local_c8;
  __node_base local_a8;
  LogicalType local_a0;
  __node_base_ptr local_88;
  _Head_base<0UL,_duckdb::NodeStatistics_*,_false> local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  _Hash_node_base *local_70;
  
  local_c8.super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_nxt = in_RCX;
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::reserve
            (&local_c8,
             (long)expr_ptr[0x31].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
             (long)expr_ptr[0x30].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl >> 3);
  for (__n = 0; __n < (ulong)((long)expr_ptr[0x31].
                                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                              - (long)expr_ptr[0x30].
                                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                      .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                      _M_head_impl >> 3); __n = __n + 1) {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 *)(expr_ptr + 0x30),__n);
    PropagateExpression((StatisticsPropagator *)local_d0,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)func);
    if (local_d0 == (undefined1  [8])0x0) {
      this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)(expr_ptr + 0x30),__n);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      LogicalType::LogicalType(&local_a0,&pEVar3->return_type);
      BaseStatistics::CreateUnknown((BaseStatistics *)&local_88,&local_a0);
      ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::
      emplace_back<duckdb::BaseStatistics>(&local_c8,(BaseStatistics *)&local_88);
      BaseStatistics::~BaseStatistics((BaseStatistics *)&local_88);
      LogicalType::~LogicalType(&local_a0);
    }
    else {
      this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                              *)local_d0);
      BaseStatistics::Copy((BaseStatistics *)&local_88,this_00);
      ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::
      emplace_back<duckdb::BaseStatistics>(&local_c8,(BaseStatistics *)&local_88);
      BaseStatistics::~BaseStatistics((BaseStatistics *)&local_88);
    }
    ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
                local_d0);
  }
  _Var1._M_head_impl =
       expr_ptr[0x28].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Expression *)0x0) {
    this->optimizer = (Optimizer *)0x0;
  }
  else {
    local_80._M_head_impl =
         (NodeStatistics *)
         expr_ptr[0x33].
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_c8;
    local_70 = local_a8._M_nxt;
    uVar2._0_1_ = (func->super_Expression).super_BaseExpression.type;
    uVar2._1_1_ = (func->super_Expression).super_BaseExpression.expression_class;
    uVar2._2_6_ = *(undefined6 *)&(func->super_Expression).super_BaseExpression.field_0xa;
    local_88 = (__node_base_ptr)expr_ptr;
    (*(code *)_Var1._M_head_impl)(this,uVar2);
  }
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::~vector(&local_c8)
  ;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StatisticsPropagator::PropagateExpression(BoundFunctionExpression &func,
                                                                     unique_ptr<Expression> &expr_ptr) {
	vector<BaseStatistics> stats;
	stats.reserve(func.children.size());
	for (idx_t i = 0; i < func.children.size(); i++) {
		auto stat = PropagateExpression(func.children[i]);
		if (!stat) {
			stats.push_back(BaseStatistics::CreateUnknown(func.children[i]->return_type));
		} else {
			stats.push_back(stat->Copy());
		}
	}
	if (!func.function.statistics) {
		return nullptr;
	}
	FunctionStatisticsInput input(func, func.bind_info.get(), stats, &expr_ptr);
	return func.function.statistics(context, input);
}